

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::StringData>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *result)

{
  bool bVar1;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  StringData value_1;
  int local_80;
  char nc;
  char c;
  string local_78;
  undefined1 local_58 [8];
  StringData value;
  vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  value._40_8_ = result;
  ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::clear
            (result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    tinyusdz::value::StringData::StringData((StringData *)local_58);
    bVar1 = ReadBasicType(this,(StringData *)local_58);
    if (bVar1) {
      ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
      push_back((vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *
                )value._40_8_,(value_type *)local_58);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_78,"Not starting with the value of requested type.\n",
                 (allocator *)&c);
      PushError(this,&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::allocator<char>::~allocator((allocator<char> *)&c);
      this_local._7_1_ = 0;
    }
    tinyusdz::value::StringData::~StringData((StringData *)local_58);
    if (bVar1) {
      do {
        bVar1 = Eof(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005a277d;
        }
        bVar1 = Char1(this,&value_1.field_0x2f);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005a277d;
        }
        if (value_1._47_1_ == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005a277d;
          }
          bVar1 = LookChar1(this,&value_1.field_0x2e);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005a277d;
          }
          if (value_1._46_1_ == end_symbol) break;
        }
        if (value_1._47_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005a277d;
        }
        tinyusdz::value::StringData::StringData((StringData *)local_b8);
        bVar1 = ReadBasicType(this,(StringData *)local_b8);
        if (bVar1) {
          ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
          push_back((vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                     *)value._40_8_,(value_type *)local_b8);
          local_80 = 0;
        }
        else {
          local_80 = 3;
        }
        tinyusdz::value::StringData::~StringData((StringData *)local_b8);
      } while (local_80 == 0);
      bVar1 = ::std::
              vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
              empty((vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                     *)value._40_8_);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_d8,"Empty array.\n",&local_d9);
        PushError(this,&local_d8);
        ::std::__cxx11::string::~string((string *)&local_d8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_005a277d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}